

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::float_writer<wchar_t>::float_writer
          (float_writer<wchar_t> *this,char *digits,int num_digits,int exp,float_specs specs,
          wchar_t decimal_point)

{
  size_t sVar1;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  int precision;
  int full_exp;
  float_writer<wchar_t> *in_stack_000001b0;
  counting_iterator in_stack_000001b8;
  int local_4c;
  counting_iterator local_40;
  counting_iterator local_38;
  int local_2c;
  int local_28;
  undefined8 local_8;
  
  *in_RDI = in_RSI;
  *(int *)(in_RDI + 1) = in_EDX;
  *(int *)((long)in_RDI + 0xc) = in_ECX;
  in_RDI[3] = in_R8;
  *(undefined4 *)(in_RDI + 4) = in_R9D;
  local_28 = in_EDX + in_ECX + -1;
  local_8._0_4_ = (int)in_R8;
  if ((int)local_8 < 1) {
    local_4c = 0x10;
  }
  else {
    local_4c = (int)local_8;
  }
  local_2c = local_4c;
  if (((char)*(undefined4 *)((long)in_RDI + 0x1c) == '\0') &&
     ((local_28 < -4 || (local_4c <= local_28)))) {
    *(uint *)((long)in_RDI + 0x1c) = *(uint *)((long)in_RDI + 0x1c) & 0xffffff00 | 1;
  }
  local_8 = in_R8;
  counting_iterator::counting_iterator(&local_40);
  local_38 = prettify<fmt::v6::internal::counting_iterator>(in_stack_000001b0,in_stack_000001b8);
  sVar1 = counting_iterator::count(&local_38);
  in_RDI[2] = sVar1;
  in_RDI[2] = (long)(int)(uint)((local_8._4_4_ >> 8 & 0xff) != 0) + in_RDI[2];
  return;
}

Assistant:

float_writer(const char* digits, int num_digits, int exp, float_specs specs,
               Char decimal_point)
      : digits_(digits),
        num_digits_(num_digits),
        exp_(exp),
        specs_(specs),
        decimal_point_(decimal_point) {
    int full_exp = num_digits + exp - 1;
    int precision = specs.precision > 0 ? specs.precision : 16;
    if (specs_.format == float_format::general &&
        !(full_exp >= -4 && full_exp < precision)) {
      specs_.format = float_format::exp;
    }
    size_ = prettify(counting_iterator()).count();
    size_ += specs.sign ? 1 : 0;
  }